

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall PrimitiveTestClass::Print(PrimitiveTestClass *this)

{
  char *__s;
  element_type *peVar1;
  long *plVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c: ",3);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)this->c);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uc: ",4);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)this->uc);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s: ",3);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->s);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"us: ",4);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i: ",3);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->i);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ui: ",4);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"l: ",3);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ul: ",4);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ll: ",4);
  poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ull: ",5);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"f: ",3);
  poVar3 = std::ostream::_M_insert<double>((double)this->f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"d: ",3);
  poVar3 = std::ostream::_M_insert<double>(this->d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ld: ",4);
  poVar3 = std::ostream::_M_insert<long_double>(this->ld);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"str: ",5);
  __s = this->str;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1431e8);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pc: ",4);
  PrintArr<char*>(this,this->pc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"puc: ",5);
  PrintArr<unsigned_char*>(this,this->puc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ps: ",4);
  PrintArr<short*>(this,this->ps);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pus: ",5);
  PrintArr<unsigned_short*>(this,this->pus);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi: ",4);
  PrintArr<int*>(this,this->pi);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pui: ",5);
  PrintArr<unsigned_int*>(this,this->pui);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pl: ",4);
  PrintArr<long*>(this,this->pl);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pul: ",5);
  PrintArr<unsigned_long*>(this,this->pul);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pll: ",5);
  PrintArr<long_long*>(this,this->pll);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pull: ",6);
  PrintArr<unsigned_long_long*>(this,this->pull);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pf: ",4);
  PrintArr<float*>(this,this->pf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pd: ",4);
  PrintArr<double*>(this,this->pd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pld: ",5);
  PrintArr<long_double*>(this,this->pld);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pto: ",5);
  if (this->SIZE != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)((long)this->pto + lVar6 + -8),
                          *(long *)((long)&(this->pto->str)._M_dataplus._M_p + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)(long)this->SIZE);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"spi: ",5);
  if (this->SIZE != 0) {
    uVar5 = 0;
    do {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          [uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(long)this->SIZE);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"spto: ",6);
  if (this->SIZE != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      peVar1 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)((long)peVar1 + lVar6 + -8),
                          *(long *)((long)&(peVar1->str)._M_dataplus._M_p + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)(long)this->SIZE);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void Print()
        {
            cout << "c: " << (int)c << endl; 
            cout << "uc: " << (int)uc << endl; 
            cout << "s: " << s << endl;
            cout << "us: " << us << endl; 
            cout << "i: " << i << endl; 
            cout << "ui: " << ui << endl; 
            cout << "l: " << l << endl; 
            cout << "ul: " << ul << endl; 
            cout << "ll: " << ll << endl; 
            cout << "ull: " << ull << endl; 
            cout << "f: " << f << endl; 
            cout << "d: " << d << endl; 
            cout << "ld: " << ld << endl; 

            cout << "str: " << str << endl;

            cout << "pc: ";
            PrintArr(pc);
            cout << "puc: ";
            PrintArr(puc);
            cout << "ps: ";
            PrintArr(ps);
            cout << "pus: ";
            PrintArr(pus);
            cout << "pi: ";
            PrintArr(pi);
            cout << "pui: ";
            PrintArr(pui);
            cout << "pl: ";
            PrintArr(pl);
            cout << "pul: ";
            PrintArr(pul);
            cout << "pll: ";
            PrintArr(pll);
            cout << "pull: ";
            PrintArr(pull);
            cout << "pf: ";
            PrintArr(pf);
            cout << "pd: ";
            PrintArr(pd);
            cout << "pld: ";
            PrintArr(pld);

            cout << "pto: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << pto[i].str << ", ";
            }
            
            cout << endl;

            cout << "spi: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << (&*spi)[i] << ", ";
            }
            
            cout << endl;

            cout << "spto: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << (&*spto)[i].str << ", ";
            }
            
            cout << endl;
        }